

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_string.c
# Opt level: O0

char * jas_strdup(char *s)

{
  size_t sVar1;
  char *p;
  size_t n;
  char *s_local;
  
  sVar1 = strlen(s);
  s_local = (char *)jas_malloc(sVar1 + 1);
  if (s_local == (char *)0x0) {
    s_local = (char *)0x0;
  }
  else {
    strcpy(s_local,s);
  }
  return s_local;
}

Assistant:

char *jas_strdup(const char *s)
{
	size_t n;
	char *p;
	n = strlen(s) + 1;
	if (!(p = jas_malloc(n))) {
		return 0;
	}
	strcpy(p, s);
	return p;
}